

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestBrokenInclude::~ParserTestBrokenInclude(ParserTestBrokenInclude *this)

{
  ParserTestBrokenInclude *this_local;
  
  ~ParserTestBrokenInclude(this);
  operator_delete(this,0x1e8);
  return;
}

Assistant:

TEST_F(ParserTest, BrokenInclude) {
  fs_.Create("include.ninja", "build\n");
  ManifestParser parser(&state, &fs_);
  string err;
  EXPECT_FALSE(parser.ParseTest("include include.ninja\n", &err));
  EXPECT_EQ("include.ninja:1: expected path\n"
            "build\n"
            "     ^ near here"
            , err);
}